

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O0

void __thiscall ZlibWriter::ZlibWriter(ZlibWriter *this)

{
  ZlibWriter *this_local;
  
  this->_vptr_ZlibWriter = (_func_int **)&PTR__ZlibWriter_00112d88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->zbuf);
  this->zbuf_changed = false;
  reset_zlib(this,-1);
  return;
}

Assistant:

ZlibWriter::ZlibWriter() :
	zbuf_changed(false)
{
	reset_zlib(Z_DEFAULT_COMPRESSION);
}